

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O1

int pt_encode_ip(pt_encoder *encoder,pt_opcode op,pt_packet_ip *packet)

{
  pt_ip_compression pVar1;
  bool bVar2;
  bool bVar3;
  pt_ip_compression pVar4;
  ulong uVar5;
  pt_ip_compression pVar6;
  pt_ip_compression pVar7;
  byte *pbVar8;
  
  if (packet == (pt_packet_ip *)0x0) {
    return 1;
  }
  pVar1 = packet->ipc;
  switch(pVar1) {
  case pt_ipc_suppressed:
    bVar3 = true;
    bVar2 = false;
    pVar6 = pVar1;
    goto LAB_0010930a;
  case pt_ipc_update_16:
    pVar6 = pt_ipc_update_32;
    break;
  case pt_ipc_update_32:
    pVar6 = pt_ipc_update_48;
    break;
  case pt_ipc_sext_48:
  case pt_ipc_update_48:
    pVar6 = pt_ipc_full;
    break;
  default:
    pVar6 = ~pt_ipc_update_16;
    bVar2 = true;
    goto LAB_00109307;
  case pt_ipc_full:
    pVar6 = 8;
  }
  bVar2 = false;
LAB_00109307:
  bVar3 = false;
LAB_0010930a:
  if (bVar2) {
    return pVar6;
  }
  pVar7 = pVar6 | pt_ipc_update_16;
  pbVar8 = encoder->pos;
  if (pbVar8 == (byte *)0x0) {
    pVar4 = ~pt_ipc_suppressed;
  }
  else {
    pVar4 = ~pt_ipc_full;
    if (((encoder->config).begin <= pbVar8 + pVar7) &&
       (pVar4 = ~pt_ipc_full, pbVar8 + pVar7 <= (encoder->config).end)) {
      pVar4 = pt_ipc_suppressed;
    }
  }
  if (-1 < (int)pVar4) {
    *pbVar8 = (byte)(pVar1 << 5) | (byte)op;
    pbVar8 = pbVar8 + 1;
    if (!bVar3) {
      uVar5 = packet->ip;
      do {
        *pbVar8 = (byte)uVar5;
        pbVar8 = pbVar8 + 1;
        uVar5 = uVar5 >> 8;
        pVar6 = pVar6 - pt_ipc_update_16;
      } while (pVar6 != pt_ipc_suppressed);
    }
    encoder->pos = pbVar8;
    pVar4 = pVar7;
  }
  return pVar4;
}

Assistant:

static int pt_encode_ip(struct pt_encoder *encoder, enum pt_opcode op,
			const struct pt_packet_ip *packet)
{
	uint8_t *pos;
	uint8_t opc, ipc;
	int size, errcode;

	if (!encoder || !packet)
		return pte_internal;

	size = pt_ipc_size(packet->ipc);
	if (size < 0)
		return size;

	errcode = pt_reserve(encoder,
			     /* opc size = */ 1u + (unsigned int) size);
	if (errcode < 0)
		return errcode;

	/* We already checked the ipc in pt_ipc_size(). */
	ipc = (uint8_t) (packet->ipc << pt_opm_ipc_shr);
	opc = (uint8_t) op;

	pos = encoder->pos;
	*pos++ = opc | ipc;

	encoder->pos = pt_encode_int(pos, packet->ip, size);
	return /* opc size = */ 1 + size;
}